

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_conn.c
# Opt level: O0

ares_status_t ares_conn_connect(ares_conn_t *conn,sockaddr *sa,ares_socklen_t salen)

{
  ares_conn_err_t aVar1;
  ares_conn_err_t err;
  ares_socklen_t salen_local;
  sockaddr *sa_local;
  ares_conn_t *conn_local;
  
  aVar1 = ares_socket_connect(conn->server->channel,conn->fd,
                              (uint)((conn->flags & ARES_CONN_FLAG_TFO) != ARES_CONN_FLAG_NONE),sa,
                              salen);
  if ((aVar1 == ARES_CONN_ERR_WOULDBLOCK) || (aVar1 == ARES_CONN_ERR_SUCCESS)) {
    conn_local._4_4_ = ARES_SUCCESS;
  }
  else {
    conn_local._4_4_ = ARES_ECONNREFUSED;
  }
  return conn_local._4_4_;
}

Assistant:

static ares_status_t ares_conn_connect(ares_conn_t           *conn,
                                       const struct sockaddr *sa,
                                       ares_socklen_t         salen)
{
  ares_conn_err_t err;

  err = ares_socket_connect(
    conn->server->channel, conn->fd,
    (conn->flags & ARES_CONN_FLAG_TFO) ? ARES_TRUE : ARES_FALSE, sa, salen);

  if (err != ARES_CONN_ERR_WOULDBLOCK && err != ARES_CONN_ERR_SUCCESS) {
    return ARES_ECONNREFUSED;
  }
  return ARES_SUCCESS;
}